

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_ringbuf.c
# Opt level: O0

RingBufferHandle RingBufferCreate(int size)

{
  RingBuf *ring_buf;
  RingBuf *pRStack_10;
  int size_local;
  
  if (size < 1) {
    pRStack_10 = (RingBuf *)0x0;
  }
  else {
    pRStack_10 = _create_ring_buf();
    _init_ring_buf(pRStack_10,size);
  }
  return pRStack_10;
}

Assistant:

RingBufferHandle RingBufferCreate(int size) {
  RingBuf *ring_buf;
  if (size <= 0) {
    return (RingBufferHandle)NULL;
  }
  ring_buf = _create_ring_buf();
  _init_ring_buf(ring_buf, size);
  return (RingBufferHandle)ring_buf;
}